

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall mathOps_hypot_Test::TestBody(mathOps_hypot_Test *this)

{
  unit *this_00;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c0;
  Message local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_2;
  measurement res2;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [3];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  measurement res;
  measurement m2;
  measurement m1;
  mathOps_hypot_Test *this_local;
  
  this_00 = &m2.units_;
  units::measurement::measurement((measurement *)this_00,5.0,(unit *)&units::m);
  units::measurement::measurement((measurement *)&res.units_,5.4,(unit *)&units::in);
  join_0x00000000_0x00001200_ =
       units::hypot<units::measurement,units::measurement,void>
                 ((measurement *)this_00,(measurement *)&res.units_);
  testing::internal::CmpHelperGT<units::measurement,units::measurement>
            ((internal *)local_50,"res","m1",(measurement *)&gtest_ar.message_,
             (measurement *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  testing::internal::CmpHelperGT<units::measurement,units::measurement>
            ((internal *)local_80,"res","m2",(measurement *)&gtest_ar.message_,
             (measurement *)&res.units_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&res2.units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&res2.units_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&res2.units_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  join_0x00000000_0x00001200_ =
       units::hypot<units::measurement,units::measurement,void>
                 ((measurement *)&res.units_,(measurement *)&m2.units_);
  testing::internal::EqHelper::Compare<units::measurement,_units::measurement,_nullptr>
            ((EqHelper *)local_b0,"res","res2",(measurement *)&gtest_ar.message_,
             (measurement *)&gtest_ar_2.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0xb0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  return;
}

Assistant:

TEST(mathOps, hypot)
{
    measurement m1(5.0, m);
    measurement m2(5.4, in);

    auto res = hypot(m1, m2);
    EXPECT_GT(res, m1);
    EXPECT_GT(res, m2);

    auto res2 = hypot(m2, m1);
    EXPECT_EQ(res, res2);
}